

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pid.c
# Opt level: O0

size_t ** subsets(size_t n,inform_error *err)

{
  size_t *psVar1;
  size_t *psVar2;
  gvector pvVar3;
  ulong local_70;
  size_t j_2;
  size_t *t;
  size_t k;
  size_t *t_1;
  size_t j_1;
  size_t j;
  size_t *s;
  size_t i;
  size_t **ss;
  size_t m;
  inform_error *err_local;
  size_t n_local;
  
  if (n == 0) {
    if (err != (inform_error *)0x0) {
      *err = INFORM_EARG;
    }
    n_local = 0;
  }
  else {
    psVar1 = (size_t *)(long)(1 << ((byte)n & 0x1f));
    n_local = (size_t)gvector_alloc((long)psVar1 - 1,(long)psVar1 - 1,8);
    memset((void *)n_local,0,*(long *)(n_local + -8) << 3);
    if ((gvector)n_local == (gvector)0x0) {
      if (err != (inform_error *)0x0) {
        *err = INFORM_ENOMEM;
      }
      n_local = 0;
    }
    else {
      for (s = (size_t *)0x1; s < psVar1; s = (size_t *)((long)s + 1)) {
        j = (size_t)gvector_alloc(n,0,8);
        if ((gvector)j == (gvector)0x0) {
          for (j_1 = 0; j_1 < *(ulong *)(n_local + -8); j_1 = j_1 + 1) {
            gvector_free(*(gvector *)(n_local + j_1 * 8));
          }
          gvector_free((gvector)n_local);
          if (err != (inform_error *)0x0) {
            *err = INFORM_ENOMEM;
          }
          return (size_t **)0x0;
        }
        for (t_1 = (size_t *)0x0; t_1 < n; t_1 = (size_t *)((long)t_1 + 1)) {
          psVar2 = (size_t *)j;
          if ((((ulong)s & (long)(1 << ((byte)t_1 & 0x1f))) != 0) &&
             (psVar2 = push_value((size_t *)j,(size_t)t_1), psVar2 == (size_t *)0x0)) {
            gvector_free((gvector)j);
            for (t = (size_t *)0x0; t < *(size_t **)(n_local + -8); t = (size_t *)((long)t + 1)) {
              gvector_free(*(gvector *)(n_local + (long)t * 8));
            }
            gvector_free((gvector)n_local);
            if (err != (inform_error *)0x0) {
              *err = INFORM_ENOMEM;
            }
            return (size_t **)0x0;
          }
          j = (size_t)psVar2;
        }
        pvVar3 = gvector_shrink((gvector)j);
        if (pvVar3 == (gvector)0x0) {
          gvector_free((gvector)j);
          for (local_70 = 0; local_70 < *(ulong *)(n_local + -8); local_70 = local_70 + 1) {
            gvector_free(*(gvector *)(n_local + local_70 * 8));
          }
          gvector_free((gvector)n_local);
          if (err != (inform_error *)0x0) {
            *err = INFORM_ENOMEM;
          }
          return (size_t **)0x0;
        }
        *(gvector *)(n_local + ((long)s + -1) * 8) = pvVar3;
      }
    }
  }
  return (size_t **)n_local;
}

Assistant:

static size_t **subsets(size_t n, inform_error *err)
{
    if (n < 1)
    {
        INFORM_ERROR_RETURN(err, INFORM_EARG, NULL);
    }
    size_t m = 1 << n;
    size_t **ss = gvector_alloc(m - 1, m - 1, sizeof(size_t*));
    memset(ss, 0, sizeof(size_t*)*gvector_len(ss));
    if (!ss)
    {
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
    }
    for (size_t i = 1; i < m; ++i)
    {
        size_t *s = gvector_alloc(n, 0, sizeof(size_t));
        if (!s)
        {
            for (size_t j = 0; j < gvector_len(ss); ++j)
            {
                gvector_free(ss[j]);
            }
            gvector_free(ss);
            INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
        }
        for (size_t j = 0; j < n; ++j)
        {
            if ((i & (1 << j)) != 0)
            {
                size_t *t = push_value(s,j);
                if (!t)
                {
                    gvector_free(s);
                    for (size_t k = 0; k < gvector_len(ss); ++k)
                    {
                        gvector_free(ss[k]);
                    }
                    gvector_free(ss);
                    INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
                }
                s = t;
            }
        }
        size_t *t = gvector_shrink(s);
        if (!t)
        {
            gvector_free(s);
            for (size_t j = 0; j < gvector_len(ss); ++j)
            {
                gvector_free(ss[j]);
            }
            gvector_free(ss);
            INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
        }
        s = t;
        ss[i-1] = s;
    }
    return ss;
}